

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Schema __thiscall capnp::Schema::getDependency(Schema *this,uint64_t id,uint location)

{
  Dependency *pDVar1;
  Initializer *pIVar2;
  RawSchema *pRVar3;
  Initializer *pIVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar9;
  uint uVar11;
  uint uVar12;
  RawBrandedSchema *unaff_R15;
  Fault f;
  CappedArray<char,_17UL> local_50;
  ulong uVar8;
  ulong uVar10;
  
  uVar9 = (ulong)this->raw->dependencyCount;
  uVar12 = 0;
  do {
    uVar11 = uVar12;
    uVar5 = (uint)uVar9;
    if (uVar5 <= uVar11) break;
    uVar6 = uVar11 + uVar5 >> 1;
    uVar8 = (ulong)uVar6;
    pDVar1 = this->raw->dependencies;
    uVar7 = pDVar1[uVar8].location;
    uVar12 = uVar11;
    if (uVar7 == location) {
      unaff_R15 = pDVar1[uVar8].schema;
      pIVar2 = unaff_R15->lazyInitializer;
      uVar8 = uVar9;
      if (pIVar2 != (Initializer *)0x0) {
        (**pIVar2->_vptr_Initializer)(pIVar2,unaff_R15);
      }
    }
    else if (uVar7 < location) {
      uVar8 = uVar9;
      uVar12 = uVar6 + 1;
    }
    uVar9 = uVar8;
  } while (uVar7 != location);
  if (uVar5 <= uVar11) {
    uVar9 = (ulong)this->raw->generic->dependencyCount;
    uVar12 = 0;
    do {
      uVar11 = uVar12;
      uVar5 = (uint)uVar9;
      if (uVar5 <= uVar11) break;
      uVar7 = uVar5 + uVar11 >> 1;
      uVar10 = (ulong)uVar7;
      pRVar3 = this->raw->generic->dependencies[uVar10];
      uVar8 = pRVar3->id;
      uVar12 = uVar11;
      if (uVar8 == id) {
        pIVar4 = pRVar3->lazyInitializer;
        if (pIVar4 != (Initializer *)0x0) {
          (**pIVar4->_vptr_Initializer)(pIVar4,pRVar3);
        }
        unaff_R15 = &pRVar3->defaultBrand;
        uVar10 = uVar9;
      }
      else if (uVar8 < id) {
        uVar10 = uVar9;
        uVar12 = uVar7 + 1;
      }
      uVar9 = uVar10;
    } while (uVar8 != id);
    if (uVar5 <= uVar11) {
      kj::hex(&local_50,id);
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44],kj::CappedArray<char,17ul>>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
                 ,0xf5,FAILED,(char *)0x0,
                 "\"Requested ID not found in dependency table.\", kj::hex(id)",
                 (char (*) [44])"Requested ID not found in dependency table.",&local_50);
      kj::_::Debug::Fault::~Fault(&f);
      unaff_R15 = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
    }
  }
  return (Schema)unaff_R15;
}

Assistant:

Schema Schema::getDependency(uint64_t id, uint location) const {
  {
    // Binary search dependency list.
    uint lower = 0;
    uint upper = raw->dependencyCount;

    while (lower < upper) {
      uint mid = (lower + upper) / 2;

      auto candidate = raw->dependencies[mid];
      if (candidate.location == location) {
        candidate.schema->ensureInitialized();
        return Schema(candidate.schema);
      } else if (candidate.location < location) {
        lower = mid + 1;
      } else {
        upper = mid;
      }
    }
  }

  {
    uint lower = 0;
    uint upper = raw->generic->dependencyCount;

    while (lower < upper) {
      uint mid = (lower + upper) / 2;

      const _::RawSchema* candidate = raw->generic->dependencies[mid];

      uint64_t candidateId = candidate->id;
      if (candidateId == id) {
        candidate->ensureInitialized();
        return Schema(&candidate->defaultBrand);
      } else if (candidateId < id) {
        lower = mid + 1;
      } else {
        upper = mid;
      }
    }
  }

  KJ_FAIL_REQUIRE("Requested ID not found in dependency table.", kj::hex(id)) {
    return Schema();
  }
}